

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

translation_t *
opengv::relative_pose::twopt(RelativeAdapterBase *adapter,bool unrotate,size_t index0,size_t index1)

{
  undefined8 in_RCX;
  byte in_DL;
  long *in_RSI;
  RelativeAdapterBase *in_RDI;
  undefined8 in_R8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  ReturnType RVar1;
  Vector3d opticalFlow;
  Vector3d normal2;
  Vector3d normal1;
  rotation_t R12;
  bearingVector_t f2prime;
  bearingVector_t f2;
  bearingVector_t f1prime;
  bearingVector_t f1;
  translation_t *translation;
  RelativeAdapterBase *this_00;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe88;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe90;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffeb0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff08;
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  undefined8 local_28;
  undefined8 local_20;
  byte local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  this_00 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_40,in_RSI,in_RCX);
  (**(code **)(*local_10 + 0x18))(local_58,local_10,local_20);
  (**(code **)(*local_10 + 0x10))(local_70,local_10,local_28);
  (**(code **)(*local_10 + 0x18))(local_88,local_10,local_28);
  if ((local_11 & 1) != 0) {
    RelativeAdapterBase::getR12(in_RDI);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_RDI);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_RDI);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this,in_stack_fffffffffffffeb0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_RDI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_RDI);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI);
  if (RVar1 < 0.0) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-(in_stack_fffffffffffffe88);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_RDI);
  }
  return (translation_t *)this_00;
}

Assistant:

opengv::translation_t
opengv::relative_pose::twopt(
    const RelativeAdapterBase & adapter,
    bool unrotate,
    size_t index0,
    size_t index1 )
{
  bearingVector_t f1 = adapter.getBearingVector1(index0);
  bearingVector_t f1prime = adapter.getBearingVector2(index0);
  bearingVector_t f2 = adapter.getBearingVector1(index1);
  bearingVector_t f2prime = adapter.getBearingVector2(index1);

  if(unrotate)
  {
    rotation_t R12 = adapter.getR12();
    f1prime = R12 * f1prime;
    f2prime = R12 * f2prime;
  }

  Eigen::Vector3d normal1 = f1.cross(f1prime);
  Eigen::Vector3d normal2 = f2.cross(f2prime);

  translation_t translation = normal1.cross(normal2);
  translation = translation/translation.norm();

  Eigen::Vector3d opticalFlow = f1 - f1prime;
  if( opticalFlow.dot(translation) < 0 )
    translation = -translation;

  return translation;
}